

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline<ImVec2>
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  uint uVar4;
  uint uVar5;
  ImVec2 IVar6;
  uint *puVar7;
  long lVar8;
  ImVec2 IVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  uint *puVar20;
  bool bVar21;
  ImDrawVert *pIVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar31;
  ImVec2 IVar30;
  float fVar32;
  float fVar33;
  float fVar34;
  uint uVar35;
  float fVar36;
  uint uVar37;
  uint uVar38;
  float fVar39;
  float fVar40;
  float in_XMM5_Da;
  float fVar41;
  float in_XMM5_Db;
  float fVar42;
  float in_XMM7_Da;
  float in_XMM7_Db;
  float fVar43;
  float fVar44;
  float d2;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  int local_1ac;
  float local_118;
  float fStack_114;
  float local_108;
  float fStack_104;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  if (1 < points_count) {
    IVar6 = this->_Data->TexUvWhitePixel;
    uVar15 = points_count - 1;
    uVar11 = (ulong)uVar15;
    if (closed) {
      uVar11 = (ulong)(uint)points_count;
    }
    uVar4 = this->Flags;
    uVar16 = col & 0xffffff;
    uVar25 = (ulong)(uint)points_count;
    iVar26 = (int)uVar11;
    if (1.0 < thickness || (uVar4 & 1) == 0) {
      iVar17 = (uVar4 & 1) * 3 + 3;
      iVar10 = 9;
      if ((uVar4 & 1) != 0) {
        iVar10 = 0x1b;
        thickness = thickness + -1.0;
      }
      PrimReserve(this,iVar10 * iVar26,points_count * iVar17);
      fVar32 = thickness * 0.5;
      fVar36 = fVar32 + 1.0;
      fVar45 = 0.0;
      if (closed) {
        in_XMM7_Da = (*points).x - points[uVar25 - 1].x;
        in_XMM7_Db = (*points).y - points[uVar25 - 1].y;
        fVar45 = in_XMM7_Da * in_XMM7_Da + in_XMM7_Db * in_XMM7_Db;
        if (0.0 < fVar45) {
          in_XMM7_Da = in_XMM7_Da * (1.0 / SQRT(fVar45));
          in_XMM7_Db = in_XMM7_Db * (1.0 / SQRT(fVar45));
        }
      }
      uVar5 = this->_VtxCurrentIdx;
      uVar1 = (uVar4 & 1) * 2 + 2;
      lVar8 = (ulong)(uVar1 * 4) * 5;
      iVar26 = 0;
      local_1ac = 0;
      uVar13 = 0;
      do {
        uVar18 = uVar13 + 1;
        uVar14 = 0;
        if (uVar25 - 1 != uVar13) {
          uVar14 = uVar18 & 0xffffffff;
        }
        fVar31 = points[uVar13].x;
        fVar33 = points[uVar13].y;
        fVar43 = fVar31 - points[uVar14].x;
        fVar44 = fVar33 - points[uVar14].y;
        fVar46 = fVar43 * fVar43 + fVar44 * fVar44;
        if (0.0 < fVar46) {
          fVar43 = fVar43 * (1.0 / SQRT(fVar46));
          fVar44 = fVar44 * (1.0 / SQRT(fVar46));
        }
        fVar34 = fVar46;
        if (uVar13 == 0 && !closed) {
          in_XMM7_Da = -fVar43;
          in_XMM7_Db = -fVar44;
        }
        else {
          fVar46 = fVar45;
          if (uVar15 == uVar13 && !closed) {
            fVar43 = -in_XMM7_Da;
            fVar44 = -in_XMM7_Db;
            fVar34 = fVar45;
          }
        }
        fVar45 = fVar34;
        fVar42 = -in_XMM7_Db;
        fVar48 = in_XMM7_Da * fVar44 - fVar43 * in_XMM7_Db;
        fVar34 = in_XMM7_Da * fVar43 + fVar44 * in_XMM7_Db;
        if (ABS(fVar48) <= 1e-05) {
          fVar46 = in_XMM7_Db * fVar32 + fVar31;
          fVar28 = -in_XMM7_Da * fVar32 + fVar33;
          fVar40 = fVar42 * fVar32 + fVar31;
          fVar39 = in_XMM7_Da * fVar32 + fVar33;
          if ((uVar4 & 1) != 0) {
            local_118 = in_XMM7_Db * fVar36 + fVar31;
            fStack_114 = -in_XMM7_Da * fVar36 + fVar33;
            local_108 = fVar42 * fVar36 + fVar31;
            fStack_104 = in_XMM7_Da * fVar36 + fVar33;
          }
        }
        else {
          fVar39 = fVar32 / fVar48;
          if (1e-05 < fVar34) {
            fVar28 = fVar45;
            if (fVar46 <= fVar45) {
              fVar28 = fVar46;
            }
            fVar46 = ((fVar43 + in_XMM7_Da) * (fVar43 + in_XMM7_Da) +
                     (fVar44 + in_XMM7_Db) * (fVar44 + in_XMM7_Db)) * fVar39 * fVar39;
            if (fVar28 < fVar46) {
              fVar28 = fVar28 / fVar46;
              if (fVar28 < 0.0) {
                fVar28 = sqrtf(fVar28);
              }
              else {
                fVar28 = SQRT(fVar28);
              }
              fVar39 = fVar39 * fVar28;
              fVar31 = points[uVar13].x;
              fVar33 = points[uVar13].y;
            }
          }
          fVar47 = fVar44 + in_XMM7_Db;
          fVar41 = fVar43 + in_XMM7_Da;
          fVar46 = fVar31 - fVar39 * fVar41;
          fVar28 = fVar33 - fVar39 * fVar47;
          fVar40 = fVar39 * fVar41 + fVar31;
          fVar39 = fVar39 * fVar47 + fVar33;
          if ((uVar4 & 1) != 0) {
            fVar29 = fVar36 / fVar48;
            local_118 = -fVar41 * fVar29 + fVar31;
            fStack_114 = -fVar47 * fVar29 + fVar33;
            local_108 = fVar29 * fVar41 + fVar31;
            fStack_104 = fVar29 * fVar47 + fVar33;
          }
        }
        iVar10 = ((fVar48 < 0.0) - 1) + (uint)(fVar48 < 0.0);
        uVar12 = uVar1;
        if (1e-05 < fVar34) {
          fVar41 = (float)-iVar10;
          fVar42 = fVar42 * fVar41 + in_XMM7_Da;
          in_XMM7_Db = in_XMM7_Da * fVar41 + in_XMM7_Db;
          in_XMM5_Da = fVar42 * fVar32 + fVar31;
          in_XMM5_Db = in_XMM7_Db * fVar32 + fVar33;
          fVar48 = fVar44 * fVar41 + fVar43;
          fVar41 = -fVar43 * fVar41 + fVar44;
          local_48 = fVar48 * fVar32 + fVar31;
          fStack_44 = fVar41 * fVar32 + fVar33;
          uVar12 = 3;
          if ((uVar4 & 1) != 0) {
            local_58 = fVar42 * fVar36 + fVar31;
            fStack_54 = in_XMM7_Db * fVar36 + fVar33;
            local_68 = fVar48 * fVar36 + fVar31;
            fStack_64 = fVar41 * fVar36 + fVar33;
            uVar12 = 6;
          }
        }
        in_XMM7_Da = -fVar43;
        bVar27 = 1e-05 < fVar34;
        bVar21 = 0 < iVar10 && bVar27;
        bVar19 = iVar10 < 0 && bVar27;
        pIVar22 = this->_VtxWritePtr;
        uVar24 = (uint)bVar21;
        uVar35 = (int)(uVar24 << 0x1f) >> 0x1f;
        uVar37 = (int)(uVar24 << 0x1f) >> 0x1f;
        pIVar22->pos = (ImVec2)(CONCAT44(~uVar37 & (uint)fVar28,~uVar35 & (uint)fVar46) |
                               CONCAT44((uint)in_XMM5_Db & uVar37,(uint)in_XMM5_Da & uVar35));
        pIVar22->uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->col = col;
        uVar35 = (uint)bVar19;
        uVar37 = (int)(uVar35 << 0x1f) >> 0x1f;
        uVar38 = (int)(uVar35 << 0x1f) >> 0x1f;
        pIVar22[1].pos =
             (ImVec2)(CONCAT44(~uVar38 & (uint)fVar39,~uVar37 & (uint)fVar40) |
                     CONCAT44((uint)in_XMM5_Db & uVar38,(uint)in_XMM5_Da & uVar37));
        pIVar22[1].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[1].col = col;
        if (1e-05 < fVar34) {
          *(ulong *)((long)&(pIVar22->pos).x + lVar8) = CONCAT44(fStack_44,local_48);
          *(ImVec2 *)((long)&(pIVar22->uv).x + lVar8) = IVar6;
          pIVar22 = this->_VtxWritePtr;
          *(ImU32 *)((long)&pIVar22->col + lVar8) = col;
        }
        if ((uVar4 & 1) != 0) {
          uVar14 = CONCAT44((int)(uVar24 << 0x1f) >> 0x1f,(int)(uVar24 << 0x1f) >> 0x1f);
          pIVar22[2].pos =
               (ImVec2)(~uVar14 & CONCAT44(fStack_114,local_118) |
                       CONCAT44(fStack_54,local_58) & uVar14);
          pIVar22[2].uv = IVar6;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[2].col = uVar16;
          uVar14 = CONCAT44((int)(uVar35 << 0x1f) >> 0x1f,(int)(uVar35 << 0x1f) >> 0x1f);
          pIVar22[3].pos =
               (ImVec2)(~uVar14 & CONCAT44(fStack_104,local_108) |
                       CONCAT44(fStack_54,local_58) & uVar14);
          pIVar22[3].uv = IVar6;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[3].col = uVar16;
          if (1e-05 < fVar34) {
            IVar9.y = fStack_64;
            IVar9.x = local_68;
            pIVar22[5].pos = IVar9;
            pIVar22[5].uv = IVar6;
            pIVar22 = this->_VtxWritePtr;
            pIVar22[5].col = uVar16;
          }
        }
        this->_VtxWritePtr = pIVar22 + uVar12;
        if (uVar13 < uVar11) {
          uVar35 = this->_VtxCurrentIdx;
          uVar24 = uVar12 + uVar35;
          if (uVar15 <= uVar13) {
            uVar24 = uVar5;
          }
          uVar37 = 0;
          if (0 < iVar10 && bVar27) {
            uVar37 = uVar1;
          }
          uVar37 = uVar37 + uVar35;
          uVar38 = 1;
          if (iVar10 < 0 && bVar27) {
            uVar38 = uVar1;
          }
          uVar38 = uVar38 + uVar35;
          uVar23 = uVar24 + 1;
          puVar7 = this->_IdxWritePtr;
          puVar20 = puVar7 + 6;
          *puVar7 = uVar37;
          puVar7[1] = uVar38;
          puVar7[2] = uVar23;
          puVar7[3] = uVar37;
          puVar7[4] = uVar23;
          puVar7[5] = uVar24;
          this->_IdxWritePtr = puVar20;
          if (fVar34 <= 1e-05) {
            local_1ac = local_1ac + 3;
          }
          else {
            puVar7[6] = uVar37;
            puVar7[7] = uVar38;
            puVar7[8] = uVar35 - (~-iVar10 >> 0x1f);
            puVar20 = puVar7 + 9;
            this->_IdxWritePtr = puVar20;
          }
          if ((uVar4 & 1) != 0) {
            uVar35 = this->_VtxCurrentIdx + 2 + (uint)bVar21 + (uint)bVar21 * 2;
            uVar2 = this->_VtxCurrentIdx + 3 + (uint)bVar19 * 2;
            *puVar20 = uVar35;
            puVar20[1] = uVar37;
            puVar20[2] = uVar24;
            puVar20[3] = uVar35;
            puVar20[4] = uVar24;
            puVar20[5] = uVar24 + 2;
            puVar20[6] = uVar2;
            puVar20[7] = uVar38;
            puVar20[8] = uVar23;
            puVar20[9] = uVar2;
            puVar20[10] = uVar23;
            puVar20[0xb] = uVar24 + 3;
            this->_IdxWritePtr = puVar20 + 0xc;
            if (fVar34 <= 1e-05) {
              local_1ac = local_1ac + 6;
            }
            else {
              bVar27 = iVar10 < 0;
              iVar10 = 2 - (uint)bVar27;
              puVar20[0xc] = this->_VtxCurrentIdx + iVar10;
              puVar20[0xd] = (uint)bVar27 * 3 + this->_VtxCurrentIdx;
              puVar20[0xe] = this->_VtxCurrentIdx + bVar27 + 4;
              puVar20[0xf] = iVar10 + this->_VtxCurrentIdx;
              puVar20[0x10] = bVar27 + 4 + this->_VtxCurrentIdx;
              puVar20[0x11] = (bVar27 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar20 + 0x12;
            }
          }
        }
        iVar26 = (iVar26 + iVar17) - uVar12;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + uVar12;
        in_XMM7_Db = -fVar44;
        uVar13 = uVar18;
      } while (uVar25 != uVar18);
      pIVar3 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
      pIVar3->ElemCount = pIVar3->ElemCount - local_1ac;
      (this->VtxBuffer).Size = (this->VtxBuffer).Size - iVar26;
      (this->IdxBuffer).Size = (this->IdxBuffer).Size - local_1ac;
    }
    else {
      PrimReserve(this,iVar26 * 0xc,iVar26 * 6);
      uVar15 = (int)((float)(col >> 0x18) * thickness) << 0x18 | uVar16;
      uVar13 = 1;
      do {
        uVar18 = uVar13 & 0xffffffff;
        if (uVar25 == uVar13) {
          uVar18 = 0;
        }
        fVar45 = points[uVar13 - 1].x;
        fVar32 = points[uVar18].x - fVar45;
        fVar31 = points[uVar13 - 1].y;
        fVar36 = points[uVar18].y - fVar31;
        fVar33 = fVar32 * fVar32 + fVar36 * fVar36;
        if (0.0 < fVar33) {
          fVar33 = 1.0 / SQRT(fVar33);
          fVar36 = fVar36 * fVar33;
          fVar32 = fVar32 * fVar33;
        }
        IVar30.y = fVar31 - fVar32;
        IVar30.x = fVar45 + fVar36;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->pos = IVar30;
        pIVar22->uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->col = uVar16;
        pIVar22[1].pos = points[uVar13 - 1];
        pIVar22[1].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[1].col = uVar15;
        pIVar22[2].pos.x = points[uVar13 - 1].x - fVar36;
        pIVar22[2].pos.y = points[uVar13 - 1].y + fVar32;
        pIVar22[2].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[2].col = uVar16;
        pIVar22[3].pos.x = points[uVar18].x + fVar36;
        pIVar22[3].pos.y = points[uVar18].y - fVar32;
        pIVar22[3].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[3].col = uVar16;
        pIVar22[4].pos = points[uVar18];
        pIVar22[4].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[4].col = uVar15;
        pIVar22[5].pos.x = points[uVar18].x - fVar36;
        pIVar22[5].pos.y = points[uVar18].y + fVar32;
        pIVar22[5].uv = IVar6;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[5].col = uVar16;
        this->_VtxWritePtr = pIVar22 + 6;
        uVar4 = this->_VtxCurrentIdx;
        puVar20 = this->_IdxWritePtr;
        *puVar20 = uVar4;
        puVar20[1] = uVar4 + 1;
        puVar20[2] = this->_VtxCurrentIdx + 4;
        uVar4 = this->_VtxCurrentIdx;
        puVar20[3] = uVar4;
        puVar20[4] = uVar4 + 4;
        puVar20[5] = this->_VtxCurrentIdx + 3;
        puVar20[6] = this->_VtxCurrentIdx + 1;
        puVar20[7] = this->_VtxCurrentIdx + 2;
        puVar20[8] = this->_VtxCurrentIdx + 5;
        puVar20[9] = this->_VtxCurrentIdx + 1;
        puVar20[10] = this->_VtxCurrentIdx + 5;
        puVar20[0xb] = this->_VtxCurrentIdx + 4;
        this->_IdxWritePtr = puVar20 + 0xc;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
        bVar27 = uVar13 != uVar11;
        uVar13 = uVar13 + 1;
      } while (bVar27);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}